

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

void ZSTD_copyBlockSequences(ZSTD_CCtx *zc)

{
  size_t *psVar1;
  ushort uVar2;
  ushort uVar3;
  uint offBase;
  ZSTD_longLengthType_e ZVar4;
  size_t sVar5;
  seqDef *psVar6;
  ZSTD_Sequence *pZVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  repcodes_t updatedRepcodes;
  undefined8 local_58;
  U32 local_50;
  ZSTD_Sequence *local_48;
  ulong local_40;
  ulong local_38;
  
  sVar5 = (zc->seqCollector).seqIndex;
  uVar10 = (zc->seqCollector).maxSequences;
  if (uVar10 <= sVar5 + 1) {
    __assert_fail("zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcf8,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  psVar6 = (zc->seqStore).sequencesStart;
  uVar13 = (long)(zc->seqStore).sequences - (long)psVar6 >> 3;
  local_38 = uVar13 + 1;
  if (uVar10 < uVar13 + 1) {
    __assert_fail("zc->seqCollector.maxSequences >= seqStoreSeqSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xcfa,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
  }
  local_40 = (long)(zc->seqStore).lit - (long)(zc->seqStore).litStart;
  pZVar7 = (zc->seqCollector).seqStart;
  local_48 = pZVar7 + sVar5;
  pZVar8 = (zc->blockState).prevCBlock;
  local_50 = pZVar8->rep[2];
  local_58 = *(undefined8 *)pZVar8->rep;
  puVar11 = &pZVar7[sVar5].rep;
  uVar10 = 0;
  uVar12 = 0;
  do {
    if (uVar13 == uVar12) {
      if (uVar10 <= local_40) {
        local_48[uVar13].litLength = (int)local_40 - (int)uVar10;
        local_48[uVar13].offset = 0;
        local_48[uVar13].matchLength = 0;
        local_48[uVar13].rep = 0;
        psVar1 = &(zc->seqCollector).seqIndex;
        *psVar1 = *psVar1 + local_38;
        return;
      }
      __assert_fail("seqStoreLiteralsSize >= literalsRead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xd23,"void ZSTD_copyBlockSequences(ZSTD_CCtx *)");
    }
    offBase = psVar6[uVar12].offBase;
    uVar2 = psVar6[uVar12].litLength;
    puVar11[-2] = (uint)uVar2;
    uVar3 = psVar6[uVar12].mlBase;
    puVar11[-1] = uVar3 + 3;
    *puVar11 = 0;
    uVar9 = offBase - 3;
    if (uVar12 == (zc->seqStore).longLengthPos) {
      ZVar4 = (zc->seqStore).longLengthType;
      if (ZVar4 != ZSTD_llt_literalLength) {
        if (ZVar4 == ZSTD_llt_matchLength) {
          puVar11[-1] = uVar3 + 0x10003;
        }
        goto LAB_001ae857;
      }
      puVar11[-2] = uVar2 + 0x10000;
      if (offBase < 4) {
        *puVar11 = offBase;
        goto LAB_001ae883;
      }
    }
    else {
LAB_001ae857:
      if (offBase < 4) {
        *puVar11 = offBase;
        if (uVar2 == 0) {
          if (offBase == 3) {
            uVar9 = (U32)local_58 - 1;
          }
          else {
            uVar9 = *(uint *)((long)&local_58 + (ulong)offBase * 4);
          }
        }
        else {
LAB_001ae883:
          uVar9 = *(uint *)((long)&local_58 + (ulong)(offBase - 1) * 4);
        }
      }
    }
    ((ZSTD_Sequence *)(puVar11 + -3))->offset = uVar9;
    ZSTD_updateRep((U32 *)&local_58,offBase,(uint)(uVar2 == 0));
    uVar10 = uVar10 + puVar11[-2];
    uVar12 = uVar12 + 1;
    puVar11 = puVar11 + 4;
  } while( true );
}

Assistant:

static void ZSTD_copyBlockSequences(ZSTD_CCtx* zc)
{
    const seqStore_t* seqStore = ZSTD_getSeqStore(zc);
    const seqDef* seqStoreSeqs = seqStore->sequencesStart;
    size_t seqStoreSeqSize = seqStore->sequences - seqStoreSeqs;
    size_t seqStoreLiteralsSize = (size_t)(seqStore->lit - seqStore->litStart);
    size_t literalsRead = 0;
    size_t lastLLSize;

    ZSTD_Sequence* outSeqs = &zc->seqCollector.seqStart[zc->seqCollector.seqIndex];
    size_t i;
    repcodes_t updatedRepcodes;

    assert(zc->seqCollector.seqIndex + 1 < zc->seqCollector.maxSequences);
    /* Ensure we have enough space for last literals "sequence" */
    assert(zc->seqCollector.maxSequences >= seqStoreSeqSize + 1);
    ZSTD_memcpy(updatedRepcodes.rep, zc->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (i = 0; i < seqStoreSeqSize; ++i) {
        U32 rawOffset = seqStoreSeqs[i].offBase - ZSTD_REP_NUM;
        outSeqs[i].litLength = seqStoreSeqs[i].litLength;
        outSeqs[i].matchLength = seqStoreSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        if (seqStoreSeqs[i].offBase <= ZSTD_REP_NUM) {
            /* Derive the correct offset corresponding to a repcode */
            outSeqs[i].rep = seqStoreSeqs[i].offBase;
            if (outSeqs[i].litLength != 0) {
                rawOffset = updatedRepcodes.rep[outSeqs[i].rep - 1];
            } else {
                if (outSeqs[i].rep == 3) {
                    rawOffset = updatedRepcodes.rep[0] - 1;
                } else {
                    rawOffset = updatedRepcodes.rep[outSeqs[i].rep];
                }
            }
        }
        outSeqs[i].offset = rawOffset;
        /* seqStoreSeqs[i].offset == offCode+1, and ZSTD_updateRep() expects offCode
           so we provide seqStoreSeqs[i].offset - 1 */
        ZSTD_updateRep(updatedRepcodes.rep,
                       seqStoreSeqs[i].offBase,
                       seqStoreSeqs[i].litLength == 0);
        literalsRead += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(seqStoreLiteralsSize >= literalsRead);
    lastLLSize = seqStoreLiteralsSize - literalsRead;
    outSeqs[i].litLength = (U32)lastLLSize;
    outSeqs[i].matchLength = outSeqs[i].offset = outSeqs[i].rep = 0;
    seqStoreSeqSize++;
    zc->seqCollector.seqIndex += seqStoreSeqSize;
}